

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O2

int main(void)

{
  parameter_type P;
  parameter_type P_00;
  parameter_type P_01;
  parameter_type P_02;
  parameter_type P_03;
  parameter_type P_04;
  parameter_type P_05;
  parameter_type P_06;
  lcg64 r;
  allocator aStack_40299;
  string sStack_40298;
  string sStack_40278;
  string sStack_40258;
  string sStack_40238;
  string sStack_40218;
  string sStack_401f8;
  string sStack_401d8;
  string sStack_401b8;
  string sStack_40198;
  string sStack_40178;
  string sStack_40158;
  string sStack_40138;
  string sStack_40118;
  string sStack_400f8;
  string sStack_400d8;
  string sStack_400b8;
  string sStack_40098;
  string sStack_40078;
  string sStack_40058;
  string sStack_40038;
  lagfib2xor<unsigned_long,_9842U,_19937U> lStack_40018;
  
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64::lcg64((lcg64 *)&lStack_40018,P);
  std::__cxx11::string::string((string *)&sStack_40038,"trng::lcg64",&aStack_40299);
  sample_output<trng::lcg64>((lcg64 *)&lStack_40018,&sStack_40038);
  std::__cxx11::string::~string((string *)&sStack_40038);
  P_00.b = 1;
  P_00.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64_shift::lcg64_shift((lcg64_shift *)&lStack_40018,P_00);
  std::__cxx11::string::string((string *)&sStack_40058,"trng::lcg64_shift",&aStack_40299);
  sample_output<trng::lcg64_shift>((lcg64_shift *)&lStack_40018,&sStack_40058);
  std::__cxx11::string::~string((string *)&sStack_40058);
  trng::mrg2::mrg2((mrg2 *)&lStack_40018,(parameter_type)0x45335114595605e5);
  std::__cxx11::string::string((string *)&sStack_40078,"trng::mrg2",&aStack_40299);
  sample_output<trng::mrg2>((mrg2 *)&lStack_40018,&sStack_40078);
  std::__cxx11::string::~string((string *)&sStack_40078);
  P_03.a[2] = 0x75e21f71;
  P_03.a[0] = 0x787c73e9;
  P_03.a[1] = 0x6ce5b0df;
  trng::mrg3::mrg3((mrg3 *)&lStack_40018,P_03);
  std::__cxx11::string::string((string *)&sStack_40098,"trng::mrg3",&aStack_40299);
  sample_output<trng::mrg3>((mrg3 *)&lStack_40018,&sStack_40098);
  std::__cxx11::string::~string((string *)&sStack_40098);
  P_04.a[2] = 0x79883501;
  P_04.a[0] = 0x78b65021;
  P_04.a[1] = 0x4256534d;
  trng::mrg3s::mrg3s((mrg3s *)&lStack_40018,P_04);
  std::__cxx11::string::string((string *)&sStack_400b8,"trng::mrg3s",&aStack_40299);
  sample_output<trng::mrg3s>((mrg3s *)&lStack_40018,&sStack_400b8);
  std::__cxx11::string::~string((string *)&sStack_400b8);
  P_01.a[2] = 0x44ddb3f9;
  P_01.a[3] = 0x6370d8d2;
  P_01.a[0] = 0x7753d502;
  P_01.a[1] = 0x542dbf61;
  trng::mrg4::mrg4((mrg4 *)&lStack_40018,P_01);
  std::__cxx11::string::string((string *)&sStack_400d8,"trng::mrg4",&aStack_40299);
  sample_output<trng::mrg4>((mrg4 *)&lStack_40018,&sStack_400d8);
  std::__cxx11::string::~string((string *)&sStack_400d8);
  trng::mrg5::mrg5((mrg5 *)&lStack_40018,(parameter_type *)trng::mrg5::LEcuyer1);
  std::__cxx11::string::string((string *)&sStack_400f8,"trng::mrg5",&aStack_40299);
  sample_output<trng::mrg5>((mrg5 *)&lStack_40018,&sStack_400f8);
  std::__cxx11::string::~string((string *)&sStack_400f8);
  trng::mrg5s::mrg5s((mrg5s *)&lStack_40018,(parameter_type *)trng::mrg5s::trng0);
  std::__cxx11::string::string((string *)&sStack_40118,"trng::mrg5s",&aStack_40299);
  sample_output<trng::mrg5s>((mrg5s *)&lStack_40018,&sStack_40118);
  std::__cxx11::string::~string((string *)&sStack_40118);
  trng::yarn2::yarn2((yarn2 *)&lStack_40018,trng::yarn2::LEcuyer1);
  std::__cxx11::string::string((string *)&sStack_40138,"trng::yarn2",&aStack_40299);
  sample_output<trng::yarn2>((yarn2 *)&lStack_40018,&sStack_40138);
  std::__cxx11::string::~string((string *)&sStack_40138);
  P_05.a[2] = DAT_0016b0f0;
  P_05.a[0] = (undefined4)trng::yarn3::LEcuyer1;
  P_05.a[1] = trng::yarn3::LEcuyer1._4_4_;
  trng::yarn3::yarn3((yarn3 *)&lStack_40018,P_05);
  std::__cxx11::string::string((string *)&sStack_40158,"trng::yarn3",&aStack_40299);
  sample_output<trng::yarn3>((yarn3 *)&lStack_40018,&sStack_40158);
  std::__cxx11::string::~string((string *)&sStack_40158);
  P_06.a[2] = DAT_001cb118;
  P_06.a[0] = (undefined4)trng::yarn3s::trng0;
  P_06.a[1] = trng::yarn3s::trng0._4_4_;
  trng::yarn3s::yarn3s((yarn3s *)&lStack_40018,P_06);
  std::__cxx11::string::string((string *)&sStack_40178,"trng::yarn3s",&aStack_40299);
  sample_output<trng::yarn3s>((yarn3s *)&lStack_40018,&sStack_40178);
  std::__cxx11::string::~string((string *)&sStack_40178);
  P_02.a[2] = (undefined4)DAT_0022b138;
  P_02.a[3] = DAT_0022b138._4_4_;
  P_02.a[0] = (undefined4)trng::yarn4::LEcuyer1;
  P_02.a[1] = trng::yarn4::LEcuyer1._4_4_;
  trng::yarn4::yarn4((yarn4 *)&lStack_40018,P_02);
  std::__cxx11::string::string((string *)&sStack_40198,"trng::yarn4",&aStack_40299);
  sample_output<trng::yarn4>((yarn4 *)&lStack_40018,&sStack_40198);
  std::__cxx11::string::~string((string *)&sStack_40198);
  trng::yarn5::yarn5((yarn5 *)&lStack_40018,(parameter_type *)trng::yarn5::LEcuyer1);
  std::__cxx11::string::string((string *)&sStack_401b8,"trng::yarn5",&aStack_40299);
  sample_output<trng::yarn5>((yarn5 *)&lStack_40018,&sStack_401b8);
  std::__cxx11::string::~string((string *)&sStack_401b8);
  trng::yarn5s::yarn5s((yarn5s *)&lStack_40018,(parameter_type *)trng::yarn5s::trng0);
  std::__cxx11::string::string((string *)&sStack_401d8,"trng::yarn5s",&aStack_40299);
  sample_output<trng::yarn5s>((yarn5s *)&lStack_40018,&sStack_401d8);
  std::__cxx11::string::~string((string *)&sStack_401d8);
  trng::mt19937::mt19937((mt19937 *)&lStack_40018);
  std::__cxx11::string::string((string *)&sStack_401f8,"trng::mt19937",&aStack_40299);
  sample_output<trng::mt19937>((mt19937 *)&lStack_40018,&sStack_401f8);
  std::__cxx11::string::~string((string *)&sStack_401f8);
  trng::mt19937_64::mt19937_64((mt19937_64 *)&lStack_40018);
  std::__cxx11::string::string((string *)&sStack_40218,"trng::mt19937_64",&aStack_40299);
  sample_output<trng::mt19937_64>((mt19937_64 *)&lStack_40018,&sStack_40218);
  std::__cxx11::string::~string((string *)&sStack_40218);
  trng::lagfib2xor<unsigned_long,_9842U,_19937U>::lagfib2xor(&lStack_40018);
  std::__cxx11::string::string((string *)&sStack_40238,"trng::lagfib2xor_19937_64",&aStack_40299);
  sample_output<trng::lagfib2xor<unsigned_long,9842u,19937u>>(&lStack_40018,&sStack_40238);
  std::__cxx11::string::~string((string *)&sStack_40238);
  trng::lagfib4xor<unsigned_long,_3860U,_7083U,_11580U,_19937U>::lagfib4xor
            ((lagfib4xor<unsigned_long,_3860U,_7083U,_11580U,_19937U> *)&lStack_40018);
  std::__cxx11::string::string((string *)&sStack_40258,"trng::lagfib4xor_19937_64",&aStack_40299);
  sample_output<trng::lagfib4xor<unsigned_long,3860u,7083u,11580u,19937u>>
            ((lagfib4xor<unsigned_long,_3860U,_7083U,_11580U,_19937U> *)&lStack_40018,&sStack_40258)
  ;
  std::__cxx11::string::~string((string *)&sStack_40258);
  trng::lagfib4plus<unsigned_long,_3860U,_7083U,_11580U,_19937U>::lagfib4plus
            ((lagfib4plus<unsigned_long,_3860U,_7083U,_11580U,_19937U> *)&lStack_40018);
  std::__cxx11::string::string((string *)&sStack_40278,"trng::lagfib2plus_19937_64",&aStack_40299);
  sample_output<trng::lagfib4plus<unsigned_long,3860u,7083u,11580u,19937u>>
            ((lagfib4plus<unsigned_long,_3860U,_7083U,_11580U,_19937U> *)&lStack_40018,&sStack_40278
            );
  std::__cxx11::string::~string((string *)&sStack_40278);
  trng::lagfib2plus<unsigned_long,_9842U,_19937U>::lagfib2plus
            ((lagfib2plus<unsigned_long,_9842U,_19937U> *)&lStack_40018);
  std::__cxx11::string::string((string *)&sStack_40298,"trng::lagfib4plus_19937_64",&aStack_40299);
  sample_output<trng::lagfib2plus<unsigned_long,9842u,19937u>>
            ((lagfib2plus<unsigned_long,_9842U,_19937U> *)&lStack_40018,&sStack_40298);
  std::__cxx11::string::~string((string *)&sStack_40298);
  return 0;
}

Assistant:

int main() {
  try {
    {
      trng::lcg64 r;
      sample_output(r, "trng::lcg64");
    }
    {
      trng::lcg64_shift r;
      sample_output(r, "trng::lcg64_shift");
    }
    {
      trng::mrg2 r;
      sample_output(r, "trng::mrg2");
    }
    {
      trng::mrg3 r;
      sample_output(r, "trng::mrg3");
    }
    {
      trng::mrg3s r;
      sample_output(r, "trng::mrg3s");
    }
    {
      trng::mrg4 r;
      sample_output(r, "trng::mrg4");
    }
    {
      trng::mrg5 r;
      sample_output(r, "trng::mrg5");
    }
    {
      trng::mrg5s r;
      sample_output(r, "trng::mrg5s");
    }
    {
      trng::yarn2 r;
      sample_output(r, "trng::yarn2");
    }
    {
      trng::yarn3 r;
      sample_output(r, "trng::yarn3");
    }
    {
      trng::yarn3s r;
      sample_output(r, "trng::yarn3s");
    }
    {
      trng::yarn4 r;
      sample_output(r, "trng::yarn4");
    }
    {
      trng::yarn5 r;
      sample_output(r, "trng::yarn5");
    }
    {
      trng::yarn5s r;
      sample_output(r, "trng::yarn5s");
    }
    {
      trng::mt19937 r;
      sample_output(r, "trng::mt19937");
    }
    {
      trng::mt19937_64 r;
      sample_output(r, "trng::mt19937_64");
    }
    {
      trng::lagfib2xor_19937_64 r;
      sample_output(r, "trng::lagfib2xor_19937_64");
    }
    {
      trng::lagfib4xor_19937_64 r;
      sample_output(r, "trng::lagfib4xor_19937_64");
    }
    {
      trng::lagfib4plus_19937_64 r;
      sample_output(r, "trng::lagfib2plus_19937_64");
    }
    {
      trng::lagfib2plus_19937_64 r;
      sample_output(r, "trng::lagfib4plus_19937_64");
    }
  } catch (std::exception &err) {
    std::cerr << err.what() << std::endl;
  } catch (...) {
    std::cerr << "something went wrong" << std::endl;
  }
  return EXIT_SUCCESS;
}